

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FlowGraph.cpp
# Opt level: O2

Value * __thiscall
BasicBlock::FindValueInLocalThenGlobalValueTableAndUpdate
          (BasicBlock *this,GlobOpt *globOpt,GlobHashTable *localSymToValueMap,Instr *instr,
          Sym *dstSym,Sym *srcSym)

{
  code *pcVar1;
  bool bVar2;
  Value **ppVVar3;
  undefined4 *puVar4;
  Value *pVVar5;
  StackSym *srcSym_00;
  Value **local_38;
  
  if (dstSym == (Sym *)0x0) {
    local_38 = (Value **)0x0;
  }
  else {
    local_38 = ValueHashTable<Sym_*,_Value_*>::FindOrInsertNew(localSymToValueMap,dstSym);
  }
  ppVVar3 = ValueHashTable<Sym_*,_Value_*>::Get(localSymToValueMap,srcSym);
  if (ppVVar3 == (Value **)0x0) {
    pVVar5 = GlobOptBlockData::FindValue(&this->globOptData,srcSym);
    if ((pVVar5 != (Value *)0x0) && (globOpt->prePassLoop != (Loop *)0x0)) {
      if (srcSym->m_kind == SymKindStack) {
        srcSym_00 = Sym::AsStackSym(srcSym);
        bVar2 = GlobOpt::IsSafeToTransferInPrepass(globOpt,srcSym_00,pVVar5->valueInfo);
        if (bVar2) goto LAB_003ff2d5;
      }
      pVVar5 = (Value *)0x0;
    }
  }
  else {
    pVVar5 = *ppVVar3;
  }
LAB_003ff2d5:
  if (dstSym != (Sym *)0x0) {
    bVar2 = IsCopyTypeInstr(instr);
    if (!bVar2) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar4 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
      *puVar4 = 1;
      bVar2 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/FlowGraph.cpp"
                         ,0x1197,"(IsCopyTypeInstr(instr))","IsCopyTypeInstr(instr)");
      if (!bVar2) {
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      *puVar4 = 0;
    }
    *local_38 = pVVar5;
  }
  return pVVar5;
}

Assistant:

Value * BasicBlock::FindValueInLocalThenGlobalValueTableAndUpdate(GlobOpt *globOpt, GlobHashTable * localSymToValueMap, IR::Instr *instr, Sym *dstSym, Sym *srcSym)
{
    Value ** localDstValue = nullptr;
    Value * srcVal = nullptr;
    if (dstSym)
    {
        localDstValue = localSymToValueMap->FindOrInsertNew(dstSym);
    }
    Value ** localSrcValue = localSymToValueMap->Get(srcSym);
    if (!localSrcValue)
    {
        Value *globalValue = this->globOptData.FindValue(srcSym);
        if (globOpt->IsLoopPrePass() && globalValue && (!srcSym->IsStackSym() || !globOpt->IsSafeToTransferInPrepass(srcSym->AsStackSym(), globalValue->GetValueInfo())))
        {
            srcVal = nullptr;
        }
        else
        {
            srcVal = globalValue;
        }
    }
    else
    {
        srcVal = *localSrcValue;
    }
    if (dstSym)
    {
        Assert(IsCopyTypeInstr(instr));
        *localDstValue = srcVal;
    }

    return srcVal;
}